

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::UnknownFieldSerializerLite
               (uint8 *ptr,uint32 offset,uint32 tag,uint32 has_offset,CodedOutputStream *output)

{
  undefined8 *puVar1;
  uint8 *puVar2;
  size_t __n;
  
  if ((*(ulong *)(ptr + offset) & 1) == 0) {
    puVar1 = &fixed_address_empty_string;
    if ((init_protobuf_defaults_state & 1) == 0) {
      InitProtobufDefaultsSlow();
    }
  }
  else {
    puVar1 = (undefined8 *)((*(ulong *)(ptr + offset) & 0xfffffffffffffffe) + 8);
  }
  puVar2 = output->cur_;
  __n = (size_t)(int)puVar1[1];
  if ((long)(output->impl_).end_ - (long)puVar2 < (long)__n) {
    puVar2 = io::EpsCopyOutputStream::WriteRawFallback
                       (&output->impl_,(void *)*puVar1,(int)puVar1[1],puVar2);
  }
  else {
    memcpy(puVar2,(void *)*puVar1,__n);
    puVar2 = puVar2 + __n;
  }
  output->cur_ = puVar2;
  return;
}

Assistant:

void UnknownFieldSerializerLite(const uint8* ptr, uint32 offset, uint32 tag,
                                uint32 has_offset,
                                io::CodedOutputStream* output) {
  output->WriteString(
      reinterpret_cast<const InternalMetadata*>(ptr + offset)
          ->unknown_fields<std::string>(&internal::GetEmptyString));
}